

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall EventNotValid::~EventNotValid(EventNotValid *this)

{
  EventNotValid *this_local;
  
  ~EventNotValid(this);
  operator_delete(this);
  return;
}

Assistant:

EventNotValid(std::string reason) : EventError(reason){

    }